

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bestfitobb.cpp
# Opt level: O3

void computeOBB(uint vcount,float *points,uint pstride,float *sides,float *matrix)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  float t [3];
  ulong local_78;
  uint local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (vcount == 0) {
    local_48._8_4_ = 0xce6e6b28;
    local_48._0_8_ = 0xce6e6b28ce6e6b28;
    local_48._12_4_ = 0xce6e6b28;
    local_58._8_4_ = 0x4e6e6b28;
    local_58._0_8_ = 0x4e6e6b284e6e6b28;
    local_58._12_4_ = 0x4e6e6b28;
    auVar4 = SUB6416(ZEXT464(0xce6e6b28),0);
    auVar5 = SUB6416(ZEXT464(0x4e6e6b28),0);
  }
  else {
    local_48._8_4_ = 0xce6e6b28;
    local_48._0_8_ = 0xce6e6b28ce6e6b28;
    local_48._12_4_ = 0xce6e6b28;
    local_58._8_4_ = 0x4e6e6b28;
    local_58._0_8_ = 0x4e6e6b284e6e6b28;
    local_58._12_4_ = 0x4e6e6b28;
    auVar7 = ZEXT464(0x4e6e6b28);
    auVar6 = ZEXT464(0xce6e6b28);
    do {
      local_68 = auVar7._0_16_;
      fm_inverseRT(matrix,points,(float *)&local_78);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_78;
      points = (float *)((long)points + (ulong)pstride);
      vcount = vcount - 1;
      auVar5 = vminss_avx(ZEXT416(local_70),local_68);
      auVar7 = ZEXT1664(auVar5);
      local_58 = vminps_avx(auVar4,local_58);
      local_48 = vmaxps_avx(auVar4,local_48);
      auVar4 = vmaxss_avx(ZEXT416(local_70),ZEXT416(auVar6._0_4_));
      auVar6 = ZEXT1664(auVar4);
    } while (vcount != 0);
  }
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar2 = vandps_avx(local_58,auVar3);
  auVar5 = vandps_avx(auVar5,auVar3);
  auVar2 = vmaxps_avx(auVar2,local_48);
  auVar4 = vmaxss_avx(auVar5,auVar4);
  auVar5._0_4_ = auVar2._0_4_ + auVar2._0_4_;
  auVar5._4_4_ = auVar2._4_4_ + auVar2._4_4_;
  auVar5._8_4_ = auVar2._8_4_ + auVar2._8_4_;
  auVar5._12_4_ = auVar2._12_4_ + auVar2._12_4_;
  uVar1 = vmovlps_avx(auVar5);
  *(undefined8 *)sides = uVar1;
  sides[2] = auVar4._0_4_ + auVar4._0_4_;
  return;
}

Assistant:

void computeOBB(unsigned int vcount,const float *points,unsigned int pstride,float *sides,const float *matrix)
{
  const char *src = (const char *) points;

  float bmin[3] = { 1e9, 1e9, 1e9 };
  float bmax[3] = { -1e9, -1e9, -1e9 };

  for (unsigned int i=0; i<vcount; i++)
  {
    const float *p = (const float *) src;
    float t[3];

    fm_inverseRT(matrix, p, t ); // inverse rotate translate

    if ( t[0] < bmin[0] ) bmin[0] = t[0];
    if ( t[1] < bmin[1] ) bmin[1] = t[1];
    if ( t[2] < bmin[2] ) bmin[2] = t[2];

    if ( t[0] > bmax[0] ) bmax[0] = t[0];
    if ( t[1] > bmax[1] ) bmax[1] = t[1];
    if ( t[2] > bmax[2] ) bmax[2] = t[2];

    src+=pstride;
  }


  sides[0] = bmax[0];
  sides[1] = bmax[1];
  sides[2] = bmax[2];

  if ( fabsf(bmin[0]) > sides[0] ) sides[0] = fabsf(bmin[0]);
  if ( fabsf(bmin[1]) > sides[1] ) sides[1] = fabsf(bmin[1]);
  if ( fabsf(bmin[2]) > sides[2] ) sides[2] = fabsf(bmin[2]);

  sides[0]*=2.0f;
  sides[1]*=2.0f;
  sides[2]*=2.0f;

}